

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

BVSparseNode * __thiscall
BVSparse<Memory::ArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::ArenaAllocator> *this,BVIndex i,Type_conflict **prevNextFieldOut)

{
  Type *ppBVar1;
  uint uVar2;
  BVSparse<Memory::ArenaAllocator> *pBVar3;
  Type pBVar4;
  uint uVar5;
  BVSparse<Memory::ArenaAllocator> *pBVar6;
  BVSparse<Memory::ArenaAllocator> *pBVar7;
  uint uVar8;
  BVSparse<Memory::ArenaAllocator> *pBVar9;
  
  ppBVar1 = &this->lastFoundIndex;
  pBVar3 = (BVSparse<Memory::ArenaAllocator> *)this->head;
  if (pBVar3 == (BVSparse<Memory::ArenaAllocator> *)0x0) {
    pBVar4 = this->head;
LAB_0077b5a3:
    *ppBVar1 = pBVar4;
  }
  else {
    uVar5 = i & 0xffffffc0;
    uVar8 = *(uint *)&pBVar3->lastFoundIndex;
    if (uVar8 == uVar5) {
      *prevNextFieldOut = &this->head;
      return (BVSparseNode *)pBVar3;
    }
    pBVar9 = (BVSparse<Memory::ArenaAllocator> *)this->lastFoundIndex;
    pBVar6 = this;
    pBVar7 = pBVar3;
    if ((pBVar9 != (BVSparse<Memory::ArenaAllocator> *)0x0) &&
       (uVar2 = *(uint *)&pBVar9->lastFoundIndex, uVar2 != uVar8)) {
      if (uVar2 == uVar5) {
        *prevNextFieldOut = ppBVar1;
        return (BVSparseNode *)pBVar9;
      }
      pBVar6 = (BVSparse<Memory::ArenaAllocator> *)ppBVar1;
      if (uVar5 <= uVar2) {
        pBVar9 = pBVar3;
        pBVar6 = this;
      }
      uVar8 = *(uint *)&pBVar9->lastFoundIndex;
      pBVar7 = pBVar9;
    }
    if (uVar5 < uVar8) {
      pBVar7 = pBVar3;
      pBVar6 = this;
    }
    uVar8 = *(uint *)&pBVar7->lastFoundIndex;
    if (uVar8 < uVar5) {
      pBVar4 = (Type)0x0;
      do {
        pBVar6 = pBVar7;
        pBVar7 = (BVSparse<Memory::ArenaAllocator> *)pBVar6->head;
        if (pBVar7 == (BVSparse<Memory::ArenaAllocator> *)0x0) goto LAB_0077b5a3;
        uVar8 = *(uint *)&pBVar7->lastFoundIndex;
      } while (uVar8 < uVar5);
    }
    *ppBVar1 = pBVar6->head;
    if (uVar5 == uVar8) {
      *prevNextFieldOut = &pBVar6->head;
      return (BVSparseNode *)pBVar7;
    }
  }
  return (BVSparseNode *)0x0;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}